

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeVST2LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  ushort uVar1;
  ulong Val;
  DecodeStatus DVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint Register;
  
  DVar2 = MCDisassembler_Fail;
  switch(Insn >> 10 & 3) {
  case 0:
    Val = (ulong)(Insn >> 5) & 7;
    uVar4 = Insn >> 3 & 2;
    iVar5 = 1;
    goto LAB_0014fb9a;
  case 1:
    Val = (ulong)(Insn >> 6) & 3;
    uVar4 = Insn >> 2 & 4;
    uVar3 = Insn & 0x20;
    break;
  case 2:
    if ((Insn & 0x20) != 0) {
      return MCDisassembler_Fail;
    }
    Val = (ulong)(Insn >> 7) & 1;
    uVar4 = Insn >> 1 & 8;
    uVar3 = Insn & 0x40;
    break;
  case 3:
    goto switchD_0014fb2a_caseD_3;
  }
  iVar5 = 2 - (uint)(uVar3 == 0);
LAB_0014fb9a:
  uVar3 = Insn & 0xf;
  uVar6 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  uVar1 = GPRDecoderTable[Insn >> 0x10 & 0xf];
  MCOperand_CreateReg0(Inst,(uint)uVar1);
  if (uVar3 == 0xf) {
    MCOperand_CreateImm0(Inst,(ulong)uVar4);
  }
  else {
    MCOperand_CreateReg0(Inst,(uint)uVar1);
    MCOperand_CreateImm0(Inst,(ulong)uVar4);
    if (uVar3 == 0xd) {
      uVar3 = 0;
    }
    else {
      uVar3 = (uint)GPRDecoderTable[uVar3];
    }
    MCOperand_CreateReg0(Inst,uVar3);
  }
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar6]);
  uVar6 = iVar5 + uVar6;
  DVar2 = MCDisassembler_Fail;
  if (uVar6 < 0x20) {
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar6]);
    MCOperand_CreateImm0(Inst,Val);
    DVar2 = MCDisassembler_Success;
  }
switchD_0014fb2a_caseD_3:
  return DVar2;
}

Assistant:

static DecodeStatus DecodeVST2LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0, inc = 1;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			index = fieldFromInstruction_4(Insn, 5, 3);
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 2;
			break;
		case 1:
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 4;
			if (fieldFromInstruction_4(Insn, 5, 1))
				inc = 2;
			break;
		case 2:
			if (fieldFromInstruction_4(Insn, 5, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 7, 1);
			if (fieldFromInstruction_4(Insn, 4, 1) != 0)
				align = 8;
			if (fieldFromInstruction_4(Insn, 6, 1))
				inc = 2;
			break;
	}

	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}